

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodecpp_assert.cpp
# Opt level: O3

void nodecpp::assert::onAssertionFailed(char *file,int line,char *condString,bool shouldThrow)

{
  undefined8 *puVar1;
  undefined7 in_register_00000009;
  ModuleID local_10;
  
  local_10.str = (char *)0x0;
  log::default_log::log<char_const*,char_const*,int,char_const*>
            (&local_10,err,"File \"{}\", line {}: assertion \'{}\' failed",file,line,condString);
  if ((int)CONCAT71(in_register_00000009,shouldThrow) != 0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = fputc;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  abort();
}

Assistant:

void onAssertionFailed( const char* file, int line, const char* condString, bool shouldThrow)
	{
		nodecpp::log::default_log::error( "File \"{}\", line {}: assertion \'{}\' failed", file, line, condString );
		if ( shouldThrow )
			throw std::exception();
		else
			std::abort();
	}